

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void anon_unknown.dwarf_7921d::WriteAttributeToMemory
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out,char *name,char *type,
               uchar *data,int len)

{
  bool bVar1;
  iterator __position;
  uchar *in_RDX;
  char *in_RSI;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_RDI;
  uint in_R8D;
  int outLen;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff28;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff60;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *__last;
  char *in_stack_ffffffffffffff68;
  uchar *__first;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff70;
  const_iterator in_stack_ffffffffffffff78;
  uint local_5c;
  uchar *local_58;
  uchar *local_50;
  uchar *local_40;
  uchar *local_38;
  uint local_24;
  uchar *local_18;
  char *local_10;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *local_8;
  
  local_24 = in_R8D;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_38 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                (in_stack_ffffffffffffff28);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            (in_stack_ffffffffffffff30,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)in_stack_ffffffffffffff28);
  strlen(local_10);
  local_40 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                      insert<char_const*,void>
                                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,
                                 in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  __last = local_8;
  local_50 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                (in_stack_ffffffffffffff28);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            (in_stack_ffffffffffffff30,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)in_stack_ffffffffffffff28);
  strlen((char *)local_18);
  local_58 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                      insert<char_const*,void>
                                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,
                                 (char *)local_18,(char *)__last);
  local_5c = local_24;
  bVar1 = IsBigEndian();
  __first = local_18;
  if (bVar1) {
    swap4(&local_5c);
    __first = local_18;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_ffffffffffffff28);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            (local_8,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)in_stack_ffffffffffffff28);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,__first,(uchar *)__last);
  __position = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                         (in_stack_ffffffffffffff28);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            (local_8,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)in_stack_ffffffffffffff28);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char_const*,void>
            (in_stack_ffffffffffffff70,(const_iterator)__position._M_current,__first,(uchar *)__last
            );
  return;
}

Assistant:

void WriteAttributeToMemory(std::vector<unsigned char> &out, const char *name,
                            const char *type, const unsigned char *data,
                            int len) {
  out.insert(out.end(), name, name + strlen(name) + 1);
  out.insert(out.end(), type, type + strlen(type) + 1);

  int outLen = len;
  if (IsBigEndian()) {
    swap4(reinterpret_cast<unsigned int *>(&outLen));
  }
  out.insert(out.end(), reinterpret_cast<unsigned char *>(&outLen),
             reinterpret_cast<unsigned char *>(&outLen) + sizeof(int));
  out.insert(out.end(), data, data + len);
}